

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *This)

{
  long in_RDI;
  ktx_uint32_t alignment;
  uint32_t in_stack_fffffffffffffff0;
  uint32_t local_c;
  
  if ((*(int *)(in_RDI + 0x88) != 0) && (*(int *)(in_RDI + 0x88) != 1)) {
    if (*(int *)(in_RDI + 0x78) == 0) {
      local_c = 0x10;
    }
    else {
      local_c = lcm4(in_stack_fffffffffffffff0);
    }
    return local_c;
  }
  __assert_fail("This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x6d5,"ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *)");
}

Assistant:

ktx_uint32_t
ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2* This)
{
    ktx_uint32_t alignment;

    // Should actually work for none supercompressed but don't want to
    // encourage use of it.
    assert(This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ);

    if (This->vkFormat != VK_FORMAT_UNDEFINED)
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    else
        alignment = 16;

    return alignment;
}